

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O3

void sha1_hash(uchar *data,unsigned_long len,sha1_ctx *ctx)

{
  uint_32t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  uint uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  size_t __n;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  uVar29 = (int)len + ctx->count[0];
  uVar27 = ctx->count[0] & 0x3f;
  __n = 0x40 - (ulong)uVar27;
  ctx->count[0] = uVar29;
  if (uVar29 < len) {
    ctx->count[1] = ctx->count[1] + 1;
  }
  uVar30 = (ulong)uVar27;
  uVar31 = uVar30;
  if (__n <= len) {
    do {
      memcpy((void *)((long)ctx->wbuf + uVar30),data,__n);
      data = data + __n;
      lVar28 = 0x13;
      do {
        auVar32 = *(undefined1 (*) [16])(ctx->count + lVar28);
        auVar34[1] = 0;
        auVar34[0] = auVar32[8];
        auVar34[2] = auVar32[9];
        auVar34[3] = 0;
        auVar34[4] = auVar32[10];
        auVar34[5] = 0;
        auVar34[6] = auVar32[0xb];
        auVar34[7] = 0;
        auVar34[8] = auVar32[0xc];
        auVar34[9] = 0;
        auVar34[10] = auVar32[0xd];
        auVar34[0xb] = 0;
        auVar34[0xc] = auVar32[0xe];
        auVar34[0xd] = 0;
        auVar34[0xe] = auVar32[0xf];
        auVar34[0xf] = 0;
        auVar33 = pshuflw(auVar34,auVar34,0x1b);
        auVar34 = pshufhw(auVar33,auVar33,0x1b);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar32._0_13_;
        auVar18[0xe] = auVar32[7];
        auVar19[0xc] = auVar32[6];
        auVar19._0_12_ = auVar32._0_12_;
        auVar19._13_2_ = auVar18._13_2_;
        auVar20[0xb] = 0;
        auVar20._0_11_ = auVar32._0_11_;
        auVar20._12_3_ = auVar19._12_3_;
        auVar21[10] = auVar32[5];
        auVar21._0_10_ = auVar32._0_10_;
        auVar21._11_4_ = auVar20._11_4_;
        auVar22[9] = 0;
        auVar22._0_9_ = auVar32._0_9_;
        auVar22._10_5_ = auVar21._10_5_;
        auVar23[8] = auVar32[4];
        auVar23._0_8_ = auVar32._0_8_;
        auVar23._9_6_ = auVar22._9_6_;
        auVar24._7_8_ = 0;
        auVar24._0_7_ = auVar23._8_7_;
        auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
        auVar25[0] = auVar32[3];
        auVar25._9_6_ = 0;
        auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar26[0] = auVar32[2];
        auVar26._11_4_ = 0;
        auVar33._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar33[2] = auVar32[1];
        auVar33[0] = auVar32[0];
        auVar33[1] = 0;
        auVar33[0xf] = 0;
        auVar32 = pshuflw(auVar33,auVar33,0x1b);
        auVar32 = pshufhw(auVar32,auVar32,0x1b);
        sVar2 = auVar32._0_2_;
        sVar3 = auVar32._2_2_;
        sVar4 = auVar32._4_2_;
        sVar5 = auVar32._6_2_;
        sVar6 = auVar32._8_2_;
        sVar7 = auVar32._10_2_;
        sVar8 = auVar32._12_2_;
        sVar9 = auVar32._14_2_;
        sVar10 = auVar34._0_2_;
        sVar11 = auVar34._2_2_;
        sVar12 = auVar34._4_2_;
        sVar13 = auVar34._6_2_;
        sVar14 = auVar34._8_2_;
        sVar15 = auVar34._10_2_;
        sVar16 = auVar34._12_2_;
        sVar17 = auVar34._14_2_;
        puVar1 = ctx->count + lVar28;
        *(char *)puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar32[0] - (0xff < sVar2);
        *(char *)((long)puVar1 + 1) = (0 < sVar3) * (sVar3 < 0x100) * auVar32[2] - (0xff < sVar3);
        *(char *)((long)puVar1 + 2) = (0 < sVar4) * (sVar4 < 0x100) * auVar32[4] - (0xff < sVar4);
        *(char *)((long)puVar1 + 3) = (0 < sVar5) * (sVar5 < 0x100) * auVar32[6] - (0xff < sVar5);
        *(char *)(puVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar32[8] - (0xff < sVar6);
        *(char *)((long)puVar1 + 5) = (0 < sVar7) * (sVar7 < 0x100) * auVar32[10] - (0xff < sVar7);
        *(char *)((long)puVar1 + 6) = (0 < sVar8) * (sVar8 < 0x100) * auVar32[0xc] - (0xff < sVar8);
        *(char *)((long)puVar1 + 7) = (0 < sVar9) * (sVar9 < 0x100) * auVar32[0xe] - (0xff < sVar9);
        *(char *)(puVar1 + 2) = (0 < sVar10) * (sVar10 < 0x100) * auVar34[0] - (0xff < sVar10);
        *(char *)((long)puVar1 + 9) = (0 < sVar11) * (sVar11 < 0x100) * auVar34[2] - (0xff < sVar11)
        ;
        *(char *)((long)puVar1 + 10) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar34[4] - (0xff < sVar12);
        *(char *)((long)puVar1 + 0xb) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar34[6] - (0xff < sVar13);
        *(char *)(puVar1 + 3) = (0 < sVar14) * (sVar14 < 0x100) * auVar34[8] - (0xff < sVar14);
        *(char *)((long)puVar1 + 0xd) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar34[10] - (0xff < sVar15);
        *(char *)((long)puVar1 + 0xe) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar34[0xc] - (0xff < sVar16);
        *(char *)((long)puVar1 + 0xf) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar34[0xe] - (0xff < sVar17);
        lVar28 = lVar28 + -4;
      } while (lVar28 != 3);
      len = len - __n;
      sha1_compile(ctx);
      __n = 0x40;
      uVar30 = 0;
      uVar31 = 0;
    } while (0x3f < len);
  }
  memcpy((void *)((long)ctx->wbuf + uVar31),data,len);
  return;
}

Assistant:

VOID_RETURN sha1_hash(const unsigned char data[], unsigned long len, sha1_ctx ctx[1])
{   uint_32t pos = (uint_32t)(ctx->count[0] & SHA1_MASK),
            space = SHA1_BLOCK_SIZE - pos;
    const unsigned char *sp = data;

    if((ctx->count[0] += len) < len)
        ++(ctx->count[1]);

    while(len >= space)     /* tranfer whole blocks if possible  */
    {
        memcpy(((unsigned char*)ctx->wbuf) + pos, sp, space);
        sp += space; len -= space; space = SHA1_BLOCK_SIZE; pos = 0;
        bsw_32(ctx->wbuf, SHA1_BLOCK_SIZE >> 2);
        sha1_compile(ctx);
    }

    memcpy(((unsigned char*)ctx->wbuf) + pos, sp, len);
}